

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O3

void Cmd_weapprev(FCommandLine *argv,APlayerPawn *who,int key)

{
  FFont *font;
  DBaseStatusBar *this;
  DHUDMessageFadeOut *this_00;
  char *text;
  
  SendItemUse = (AInventory *)
                FWeaponSlots::PickPrevWeapon
                          ((FWeaponSlots *)((long)consoleplayer * 0x2a0 + 0x17e2020),
                           (player_t *)(&players + (long)consoleplayer * 0x54));
  this = StatusBar;
  if (((((AWeapon *)SendItemUse != (AWeapon *)0x0) && ((displaynametags.Value & 2U) != 0)) &&
      (StatusBar != (DBaseStatusBar *)0x0)) && (SmallFont != (FFont *)0x0)) {
    this_00 = (DHUDMessageFadeOut *)
              M_Malloc_Dbg(200,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                           ,0x1f9);
    font = SmallFont;
    text = AActor::GetTag(&SendItemUse->super_AActor,(char *)0x0);
    DHUDMessageFadeOut::DHUDMessageFadeOut
              (this_00,font,text,1.5,0.9,0,0,nametagcolor.Value,2.0,0.35);
    DBaseStatusBar::AttachMessage(this,(DHUDMessage *)this_00,0x4e504557,0);
    return;
  }
  return;
}

Assistant:

CCMD (weapprev)
{
	SendItemUse = players[consoleplayer].weapons.PickPrevWeapon (&players[consoleplayer]);
	// [BC] Option to display the name of the weapon being cycled to.
	if ((displaynametags & 2) && StatusBar && SmallFont && SendItemUse)
	{
		StatusBar->AttachMessage(new DHUDMessageFadeOut(SmallFont, SendItemUse->GetTag(),
			1.5f, 0.90f, 0, 0, (EColorRange)*nametagcolor, 2.f, 0.35f), MAKE_ID( 'W', 'E', 'P', 'N' ));
	}
}